

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

void Ver_ParsePrintErrorMessage(Ver_Man_t *p)

{
  FILE *__stream;
  char *pcVar1;
  uint uVar2;
  Ver_Man_t *p_local;
  
  p->fError = 1;
  if (p->fTopLevel == 0) {
    __stream = (FILE *)p->Output;
    pcVar1 = p->pFileName;
    uVar2 = Ver_StreamGetLineNumber(p->pReader);
    fprintf(__stream,"%s (line %d): %s\n",pcVar1,(ulong)uVar2,p->sError);
  }
  else {
    fprintf((FILE *)p->Output,"%s: %s\n",p->pFileName,p->sError);
  }
  Ver_ParseFreeData(p);
  return;
}

Assistant:

void Ver_ParsePrintErrorMessage( Ver_Man_t * p )
{
    p->fError = 1;
    if ( p->fTopLevel ) // the line number is not given
        fprintf( p->Output, "%s: %s\n", p->pFileName, p->sError );
    else // print the error message with the line number
        fprintf( p->Output, "%s (line %d): %s\n", 
            p->pFileName, Ver_StreamGetLineNumber(p->pReader), p->sError );
    // free the data
    Ver_ParseFreeData( p );
}